

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csp_io.c
# Opt level: O0

int csp_transaction_persistent
              (csp_conn_t *conn,uint32_t timeout,void *outbuf,int outlen,void *inbuf,int inlen)

{
  csp_packet_t *pcVar1;
  int in_ECX;
  void *in_RDX;
  void *in_R8;
  uint in_R9D;
  int length;
  csp_packet_t *packet;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  undefined4 in_stack_ffffffffffffffc8;
  uint local_4;
  
  if (in_ECX < 0x101) {
    pcVar1 = csp_buffer_get(0x109b70);
    if (pcVar1 == (csp_packet_t *)0x0) {
      local_4 = 0;
    }
    else {
      if ((0 < in_ECX) && (in_RDX != (void *)0x0)) {
        memcpy(&pcVar1->field_5,in_RDX,(long)in_ECX);
      }
      pcVar1->length = (uint16_t)in_ECX;
      csp_send((csp_conn_t *)pcVar1,
               (csp_packet_t *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
      if (in_R9D == 0) {
        local_4 = 1;
      }
      else {
        pcVar1 = csp_read((csp_conn_t *)CONCAT44(in_R9D,in_stack_ffffffffffffffc8),
                          (uint32_t)((ulong)pcVar1 >> 0x20));
        if (pcVar1 == (csp_packet_t *)0x0) {
          local_4 = 0;
        }
        else if ((in_R9D == 0xffffffff) || (pcVar1->length == in_R9D)) {
          memcpy(in_R8,&pcVar1->field_5,(ulong)pcVar1->length);
          local_4 = (uint)pcVar1->length;
          csp_buffer_free(pcVar1);
        }
        else {
          csp_dbg_inval_reply = csp_dbg_inval_reply + '\x01';
          csp_buffer_free(pcVar1);
          local_4 = 0;
        }
      }
    }
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int csp_transaction_persistent(csp_conn_t * conn, uint32_t timeout, void * outbuf, int outlen, void * inbuf, int inlen) {

	if(outlen > CSP_BUFFER_SIZE){
		return 0;
	}

	csp_packet_t * packet = csp_buffer_get(0);
	if (packet == NULL)
		return 0;

	/* Copy the request */
	if (outlen > 0 && outbuf != NULL)
		memcpy(packet->data, outbuf, outlen);
	packet->length = outlen;

	csp_send(conn, packet);

	/* If no reply is expected, return now */
	if (inlen == 0)
		return 1;

	packet = csp_read(conn, timeout);
	if (packet == NULL)
		return 0;

	if ((inlen != -1) && ((int)packet->length != inlen)) {
		csp_dbg_inval_reply++;
		csp_buffer_free(packet);
		return 0;
	}

	memcpy(inbuf, packet->data, packet->length);
	int length = packet->length;
	csp_buffer_free(packet);
	return length;
}